

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

hugeint_t duckdb::GreatestCommonDivisor<duckdb::hugeint_t>(hugeint_t left,hugeint_t right)

{
  bool bVar1;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t iVar2;
  TryAbsOperator *this;
  hugeint_t input;
  hugeint_t right_local;
  hugeint_t b;
  hugeint_t a;
  hugeint_t local_78;
  hugeint_t left_local;
  hugeint_t local_58;
  hugeint_t local_48;
  hugeint_t local_38;
  hugeint_t local_28;
  uint64_t uVar3;
  
  right_local.upper = right.upper;
  right_local.lower = right.lower;
  a.upper = left.upper;
  a.lower = left.lower;
  local_78.lower = 0;
  local_78.upper = -0x8000000000000000;
  b.lower = right_local.lower;
  b.upper = right_local.upper;
  left_local.lower = a.lower;
  left_local.upper = a.upper;
  bVar1 = hugeint_t::operator==(&left_local,&local_78);
  if (bVar1) {
    hugeint_t::hugeint_t(&local_38,-1);
    bVar1 = hugeint_t::operator==(&right_local,&local_38);
    if (!bVar1) goto LAB_01e5c105;
LAB_01e5c13f:
    hugeint_t::hugeint_t(&local_28,1);
  }
  else {
LAB_01e5c105:
    hugeint_t::hugeint_t(&local_48,-1);
    bVar1 = hugeint_t::operator==(&left_local,&local_48);
    if (bVar1) {
      local_58.lower = 0;
      local_58.upper = -0x8000000000000000;
      bVar1 = hugeint_t::operator==(&right_local,&local_58);
      if (bVar1) goto LAB_01e5c13f;
    }
    while( true ) {
      hugeint_t::hugeint_t(&local_78,0);
      bVar1 = hugeint_t::operator==(&a,&local_78);
      iVar2 = extraout_RDX;
      uVar3 = b.upper;
      this = (TryAbsOperator *)b.lower;
      if (bVar1) break;
      hugeint_t::operator%=(&b,&a);
      hugeint_t::hugeint_t(&local_78,0);
      bVar1 = hugeint_t::operator==(&b,&local_78);
      iVar2 = extraout_RDX_00;
      uVar3 = a.upper;
      this = (TryAbsOperator *)a.lower;
      if (bVar1) break;
      hugeint_t::operator%=(&a,&b);
    }
    input.upper = iVar2;
    input.lower = uVar3;
    local_28 = TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(this,input);
  }
  return local_28;
}

Assistant:

TA GreatestCommonDivisor(TA left, TA right) {
	TA a = left;
	TA b = right;

	// This protects the following modulo operations from a corner case,
	// where we would get a runtime error due to an integer overflow.
	if ((left == NumericLimits<TA>::Minimum() && right == -1) ||
	    (left == -1 && right == NumericLimits<TA>::Minimum())) {
		return 1;
	}

	while (true) {
		if (a == 0) {
			return TryAbsOperator::Operation<TA, TA>(b);
		}
		b %= a;

		if (b == 0) {
			return TryAbsOperator::Operation<TA, TA>(a);
		}
		a %= b;
	}
}